

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  nk_bool nVar1;
  int iVar2;
  int iVar3;
  nk_chart *__s;
  size_t __n;
  size_t __n_00;
  float fVar4;
  float max_value;
  float fVar5;
  
  if (count != 0 && (value_getter != (_func_float_void_ptr_int *)0x0 && ctx != (nk_context *)0x0)) {
    fVar4 = (*value_getter)(userdata,offset);
    max_value = fVar4;
    fVar5 = fVar4;
    iVar2 = offset;
    iVar3 = count;
    if (0 < count) {
      do {
        fVar4 = (*value_getter)(userdata,iVar2);
        if (max_value <= fVar4) {
          max_value = fVar4;
        }
        if (fVar5 <= fVar4) {
          fVar4 = fVar5;
        }
        iVar3 = iVar3 + -1;
        fVar5 = fVar4;
        iVar2 = iVar2 + 1;
      } while (iVar3 != 0);
    }
    nVar1 = nk_chart_begin_colored
                      (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,
                       fVar4,max_value);
    if (nVar1 != 0) {
      if (0 < count) {
        do {
          fVar4 = (*value_getter)(userdata,offset);
          nk_chart_push_slot(ctx,fVar4,0);
          offset = offset + 1;
          count = count + -1;
        } while (count != 0);
      }
      if (ctx->current != (nk_window *)0x0) {
        __s = &ctx->current->layout->chart;
        __n = (ulong)__s & 3;
        if (__n == 0) {
          __n = 0xb4;
        }
        else {
          __n_00 = -__n + 4;
          memset(__s,0,__n_00);
          memset((void *)((long)__s + __n_00),0,0xb0);
          __s = (nk_chart *)((long)__s + -__n + 0xb4);
        }
        memset(__s,0,__n);
        return;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
float(*value_getter)(void* user, int index), int count, int offset)
{
int i = 0;
float min_value;
float max_value;

NK_ASSERT(ctx);
NK_ASSERT(value_getter);
if (!ctx || !value_getter || !count) return;

max_value = min_value = value_getter(userdata, offset);
for (i = 0; i < count; ++i) {
float value = value_getter(userdata, i + offset);
min_value = NK_MIN(value, min_value);
max_value = NK_MAX(value, max_value);
}

if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
for (i = 0; i < count; ++i)
nk_chart_push(ctx, value_getter(userdata, i + offset));
nk_chart_end(ctx);
}
}